

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

long __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::update
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,label_key_type labels_value,
          long value)

{
  long lVar1;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  view;
  anon_class_1_0_00000001 local_31;
  key_type local_30;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_bool>
  local_28;
  
  local_30._M_ptr = labels_value->_M_elems;
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<137ul>>
  ::
  try_emplace_with_op<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::try_emplace<std::array<std::__cxx11::string,2ul>const&>(std::array<std::__cxx11::string,2ul>const&)::_lambda(auto:1)_1_,std::array<std::__cxx11::string,2ul>const&>
            (&local_28,
             &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).map_,
             &local_30,&local_31,labels_value);
  LOCK();
  lVar1 = ((local_28.first.
            super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->value).super___atomic_base<long>._M_i;
  ((local_28.first.
    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->value).super___atomic_base<long>._M_i = value;
  UNLOCK();
  if (local_28.first.
      super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.first.
               super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return lVar1;
}

Assistant:

value_type update(label_key_type labels_value, value_type value) {
    return Base::try_emplace(labels_value)
        .first->value.exchange(value, std::memory_order::relaxed);
  }